

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::SetWriteThroughSymbolsSetForRegion
          (BackwardPass *this,BasicBlock *catchOrFinallyBlock,Region *tryRegion)

{
  Type TVar1;
  Type pJVar2;
  Region *pRVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  BVUnitT<unsigned_long> local_38;
  SparseBVUnit _unit;
  
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->func->m_alloc,0x3d6ef4);
  pJVar2 = this->func->m_alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar2;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  tryRegion->writeThroughSymbolsSet = pBVar8;
  bVar6 = DoByteCodeUpwardExposedUsed(this);
  if (bVar6) {
    pBVar8 = catchOrFinallyBlock->byteCodeUpwardExposedUsed;
    if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x228b,"(catchOrFinallyBlock->byteCodeUpwardExposedUsed)",
                         "catchOrFinallyBlock->byteCodeUpwardExposedUsed");
      if (!bVar6) goto LAB_003d19ce;
      *puVar9 = 0;
      pBVar8 = catchOrFinallyBlock->byteCodeUpwardExposedUsed;
    }
    bVar6 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar8);
    if (!bVar6) {
      pBVar8 = catchOrFinallyBlock->byteCodeUpwardExposedUsed;
      while (pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)pBVar8->head,
            pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        TVar1 = *(Type *)&pBVar8->lastFoundIndex;
        local_38.word = ((Type *)&pBVar8->alloc)->word;
        while (local_38.word != 0) {
          lVar4 = 0;
          if (local_38.word != 0) {
            for (; (local_38.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear(&local_38,(BVIndex)lVar4);
          BVSparse<Memory::JitArenaAllocator>::Set
                    (tryRegion->writeThroughSymbolsSet,(BVIndex)lVar4 + TVar1);
        }
      }
    }
    pRVar3 = tryRegion->parent;
    if (pRVar3->type == RegionTypeTry) {
      pBVar8 = pRVar3->writeThroughSymbolsSet;
      if (pBVar8 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x22a8,"(parentTry->writeThroughSymbolsSet)",
                           "parentTry->writeThroughSymbolsSet");
        if (!bVar6) {
LAB_003d19ce:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
        pBVar8 = pRVar3->writeThroughSymbolsSet;
      }
      else {
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      while (pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)pBVar8->head,
            pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        TVar1 = *(Type *)&pBVar8->lastFoundIndex;
        local_38.word = ((Type *)&pBVar8->alloc)->word;
        while (local_38.word != 0) {
          lVar4 = 0;
          if (local_38.word != 0) {
            for (; (local_38.word >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
            }
          }
          BVUnitT<unsigned_long>::Clear(&local_38,(BVIndex)lVar4);
          BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (tryRegion->writeThroughSymbolsSet,TVar1 + (BVIndex)lVar4);
          if (BVar7 == '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x22ab,"(tryRegion->writeThroughSymbolsSet->Test(id))",
                               "tryRegion->writeThroughSymbolsSet->Test(id)");
            if (!bVar6) goto LAB_003d19ce;
            *puVar9 = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::SetWriteThroughSymbolsSetForRegion(BasicBlock * catchOrFinallyBlock, Region * tryRegion)
{
    tryRegion->writeThroughSymbolsSet = JitAnew(this->func->m_alloc, BVSparse<JitArenaAllocator>, this->func->m_alloc);

    if (this->DoByteCodeUpwardExposedUsed())
    {
        Assert(catchOrFinallyBlock->byteCodeUpwardExposedUsed);
        if (!catchOrFinallyBlock->byteCodeUpwardExposedUsed->IsEmpty())
        {
            FOREACH_BITSET_IN_SPARSEBV(id, catchOrFinallyBlock->byteCodeUpwardExposedUsed)
            {
                tryRegion->writeThroughSymbolsSet->Set(id);
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#if DBG
        // Symbols write-through in the parent try region should be marked as write-through in the current try region as well.
        // x =
        // try{
        //      try{
        //          x =         <-- x needs to be write-through here. With the current mechanism of not clearing a write-through
        //                          symbol from the bytecode upward-exposed on a def, x should be marked as write-through as
        //                          write-through symbols for a try are basically the bytecode upward exposed symbols at the
        //                          beginning of the corresponding catch block).
        //                          Verify that it still holds.
        //          <exception>
        //      }
        //      catch(){}
        //      x =
        // }
        // catch(){}
        // = x
        if (tryRegion->GetParent()->GetType() == RegionTypeTry)
        {
            Region * parentTry = tryRegion->GetParent();
            Assert(parentTry->writeThroughSymbolsSet);
            FOREACH_BITSET_IN_SPARSEBV(id, parentTry->writeThroughSymbolsSet)
            {
                Assert(tryRegion->writeThroughSymbolsSet->Test(id));
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#endif
    }
    else
    {
        // this can happen with -off:globopt
        return;
    }
}